

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  App *pAVar1;
  pointer pbVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ostream *poVar4;
  pointer pbVar5;
  pointer ppAVar6;
  pointer ppAVar7;
  string group_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  group_key.field_2._M_allocated_capacity = 0;
  group_key.field_2._8_8_ = 0;
  group_key._M_dataplus._M_p = (pointer)0x0;
  group_key._M_string_length = 0;
  App::get_subcommands(&subcommands,app,(function<bool_(const_CLI::App_*)> *)&group_key);
  std::_Function_base::~_Function_base((_Function_base *)&group_key);
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subcmd_groups_seen.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppAVar7 = subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar2 = subcmd_groups_seen.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar7 ==
        subcommands.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      for (pbVar5 = subcmd_groups_seen.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1
          ) {
        poVar4 = ::std::operator<<(local_1a8,"\n");
        poVar4 = ::std::operator<<(poVar4,(string *)pbVar5);
        ::std::operator<<(poVar4,":\n");
        group_key._M_string_length = 0;
        group_key.field_2._8_8_ =
             std::
             _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:193:13)>
             ::_M_invoke;
        group_key.field_2._M_allocated_capacity =
             (size_type)
             std::
             _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Formatter.hpp:193:13)>
             ::_M_manager;
        group_key._M_dataplus._M_p = (pointer)pbVar5;
        App::get_subcommands(&subcommands_group,app,(function<bool_(const_CLI::App_*)> *)&group_key)
        ;
        std::_Function_base::~_Function_base((_Function_base *)&group_key);
        ppAVar7 = subcommands_group.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppAVar6 = subcommands_group.
                       super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppAVar6 != ppAVar7;
            ppAVar6 = ppAVar6 + 1) {
          pAVar1 = *ppAVar6;
          if ((pAVar1->name_)._M_string_length != 0) {
            if (mode == All) {
              ::std::__cxx11::string::string((string *)&local_1d8,(string *)&pAVar1->name_);
              App::help(&group_key,pAVar1,&local_1d8,Sub);
              ::std::operator<<(local_1a8,(string *)&group_key);
              ::std::__cxx11::string::~string((string *)&group_key);
              ::std::__cxx11::string::~string((string *)&local_1d8);
              ::std::operator<<(local_1a8,"\n");
            }
            else {
              (*(this->super_FormatterBase)._vptr_FormatterBase[6])(&group_key,this,pAVar1);
              ::std::operator<<(local_1a8,(string *)&group_key);
              ::std::__cxx11::string::~string((string *)&group_key);
            }
          }
        }
        std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
                  (&subcommands_group.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
      }
      ::std::__cxx11::stringbuf::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&subcmd_groups_seen);
      std::_Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~_Vector_base
                (&subcommands.
                  super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      return __return_storage_ptr__;
    }
    pAVar1 = *ppAVar7;
    if ((pAVar1->name_)._M_string_length == 0) {
      if ((pAVar1->group_)._M_string_length != 0) {
        (*(this->super_FormatterBase)._vptr_FormatterBase[7])(&group_key);
        ::std::operator<<(local_1a8,(string *)&group_key);
        goto LAB_00113df6;
      }
    }
    else {
      ::std::__cxx11::string::string((string *)&group_key,(string *)&pAVar1->group_);
      if (group_key._M_string_length != 0) {
        _Var3 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>>
                          (subcmd_groups_seen.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           subcmd_groups_seen.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&group_key);
        if (_Var3._M_current ==
            subcmd_groups_seen.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&subcmd_groups_seen,&group_key);
        }
      }
LAB_00113df6:
      ::std::__cxx11::string::~string((string *)&group_key);
    }
    ppAVar7 = ppAVar7 + 1;
  } while( true );
}

Assistant:

inline std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty()) {
                out << make_expanded(com);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << "\n" << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << "\n";
            }
        }
    }

    return out.str();
}